

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

void __thiscall tonk::gateway::StateMachine::Initialize(StateMachine *this)

{
  ostringstream *this_00;
  OutputWorker *this_01;
  Result result;
  uint64_t seed [2];
  LogStringBuffer local_198;
  
  SecureRandom_Next((tonk *)&result,(uint8_t *)seed,0x10);
  if ((result.Error != (ErrorResult *)0x0) && (DAT_0019e060 < 4)) {
    this_00 = &local_198.LogStream;
    local_198.ChannelName = ModuleLogger;
    local_198.LogLevel = Warning;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,(string *)&DAT_0019e090);
    std::operator<<((ostream *)this_00,"SecureRandom failed to generate random seed");
    this_01 = logger::OutputWorker::GetInstance();
    logger::OutputWorker::Write(this_01,&local_198);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  siamese::PCGRandom::Seed(&this->Rand,seed[0],seed[1]);
  Result::~Result(&result);
  return;
}

Assistant:

void StateMachine::Initialize()
{
    uint64_t seed[2];
    Result result = SecureRandom_Next((uint8_t*)&seed[0], sizeof(seed));
    if (result.IsFail()) {
        ModuleLogger.Warning("SecureRandom failed to generate random seed");
    }
    Rand.Seed(seed[0], seed[1]);
}